

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

void __thiscall cornerstone::buffer::put(buffer *this,byte b)

{
  uint uVar1;
  long lVar2;
  overflow_error *this_00;
  uint uVar3;
  uint uVar4;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = uVar1 & 0x7fffffff;
    uVar4 = *(uint *)(this + 4);
  }
  else {
    uVar3 = (uint)*(ushort *)this;
    uVar4 = (uint)*(ushort *)(this + 2);
  }
  if (uVar3 == uVar4) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"insufficient buffer to store byte");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  if ((int)uVar1 < 0) {
    lVar2 = (ulong)*(uint *)(this + 4) + 8;
  }
  else {
    lVar2 = (ulong)*(ushort *)(this + 2) + 4;
  }
  this[lVar2] = (buffer)b;
  if ((int)uVar1 < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + 1;
  }
  else {
    *(short *)(this + 2) = *(short *)(this + 2) + 1;
  }
  return;
}

Assistant:

size_t buffer::size() const
{
    return (size_t)(__size_of_block(this));
}